

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O3

void __thiscall
duckdb::Deserializer::ReadDeletedProperty<duckdb::vector<duckdb::Value,true>>
          (Deserializer *this,field_id_t field_id,char *tag)

{
  int iVar1;
  undefined4 extraout_var;
  undefined6 in_register_00000032;
  long lVar2;
  Value val;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  Value local_60;
  
  iVar1 = (*this->_vptr_Deserializer[4])(this,CONCAT62(in_register_00000032,field_id));
  if ((char)iVar1 != '\0') {
    local_78 = 0;
    uStack_70 = 0;
    local_68 = 0;
    iVar1 = (*this->_vptr_Deserializer[8])(this);
    lVar2 = CONCAT44(extraout_var,iVar1);
    if (lVar2 != 0) {
      do {
        (*this->_vptr_Deserializer[6])(this);
        Value::Deserialize(&local_60,this);
        (*this->_vptr_Deserializer[7])(this);
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_78,&local_60);
        Value::~Value(&local_60);
        lVar2 = lVar2 + -1;
      } while (lVar2 != 0);
    }
    (*this->_vptr_Deserializer[9])(this);
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_78);
    (*this->_vptr_Deserializer[5])(this,1);
    return;
  }
  (*this->_vptr_Deserializer[5])(this,0);
  return;
}

Assistant:

inline void ReadDeletedProperty(const field_id_t field_id, const char *tag) {
		// Try to read the property. If not present, great!
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			OnOptionalPropertyEnd(false);
			return;
		}
		// Otherwise read and discard the value
		(void)Read<T>();
		OnOptionalPropertyEnd(true);
	}